

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

void rsg::(anonymous_namespace)::convertValueRangeTempl<bool,int>
               (ConstValueRangeAccess src,ValueRangeAccess dst)

{
  bool bVar1;
  Scalar SVar2;
  Scalar SVar3;
  
  bVar1 = (src.m_max)->boolVal;
  SVar2.intVal._1_3_ = 0;
  SVar2.boolVal = (src.m_min)->boolVal;
  *dst.super_ConstValueRangeAccess.m_min = SVar2;
  SVar3.intVal._1_3_ = 0;
  SVar3.boolVal = bVar1;
  *dst.super_ConstValueRangeAccess.m_max = SVar3;
  return;
}

Assistant:

ConstValueAccess			getMin					(void) const	{ return ConstValueAccess(*m_type, m_min);	}